

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

void __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
MemPool(MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void> *this,
       CachedArena<cookmem::MmapArena> *arena,NoActionMemLogger *logger,bool padding)

{
  PtrAVLTree *local_60;
  CircularList<cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
  *local_40;
  bool padding_local;
  NoActionMemLogger *logger_local;
  CachedArena<cookmem::MmapArena> *arena_local;
  MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void> *this_local;
  
  this->m_arena = arena;
  this->m_logger = logger;
  this->m_footprintLimit = 0;
  this->m_segList = (MemSegment *)0x0;
  this->m_release_checks = 0;
  this->m_smallMap = 0;
  this->m_treeMap = 0;
  local_40 = this->m_smallLists;
  do {
    CircularList<cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
    ::CircularList(local_40);
    local_40 = local_40 + 1;
  } while (local_40 !=
           (CircularList<cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
            *)this->m_largeTrees);
  local_60 = this->m_largeTrees;
  do {
    PtrAVLTree::PtrAVLTree(local_60);
    local_60 = local_60 + 1;
  } while (local_60 != (PtrAVLTree *)&this->m_footprint);
  this->m_footprint = 0;
  this->m_maxFootprint = 0;
  this->m_storingExactSize = padding;
  this->m_padding = padding;
  this->m_paddingByte = -0x33;
  return;
}

Assistant:

MemPool (Arena&     arena,
             Logger&    logger,
             bool       padding = false)
    : m_arena (arena),
      m_logger (logger),
      m_footprintLimit (0),
      m_segList (nullptr),
      m_release_checks (0),
      m_smallMap (0),
      m_treeMap (0),
      m_smallLists (),
      m_largeTrees (),
      m_footprint (0),
      m_maxFootprint (0),
      m_storingExactSize (padding),
      m_padding (padding),
      m_paddingByte (DEFAULT_PADDING_BYTE)
    {
    }